

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O1

void __thiscall
Projection::ConvertUnew(Projection *this,MultiFab *Unew,MultiFab *Uold,Real alpha,BoxArray *grids)

{
  int *piVar1;
  int *piVar2;
  Projection *this_00;
  MFIter Uoldmfi;
  MFIter local_a8;
  
  amrex::MFIter::MFIter(&local_a8,(FabArrayBase *)Uold,true);
  if (local_a8.currentIndex < local_a8.endIndex) {
    do {
      this_00 = (Projection *)&stack0xffffffffffffffbc;
      amrex::MFIter::growntilebox((Box *)&stack0xffffffffffffffbc,&local_a8,1);
      piVar1 = &local_a8.currentIndex;
      if (local_a8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar1 = ((local_a8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + local_a8.currentIndex;
      }
      piVar2 = &local_a8.currentIndex;
      if (local_a8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar2 = ((local_a8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + local_a8.currentIndex;
      }
      ConvertUnew(this_00,(Unew->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                          super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[*piVar1],
                  (Uold->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                  super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[*piVar2],alpha,
                  (Box *)&stack0xffffffffffffffbc);
      amrex::MFIter::operator++(&local_a8);
    } while (local_a8.currentIndex < local_a8.endIndex);
  }
  amrex::MFIter::~MFIter(&local_a8);
  return;
}

Assistant:

void
Projection::ConvertUnew (MultiFab&       Unew,
                         MultiFab&       Uold,
                         Real            alpha,
                         const BoxArray& grids)
{
#ifdef _OPENMP
#pragma omp parallel
#endif
  for (MFIter Uoldmfi(Uold,true); Uoldmfi.isValid(); ++Uoldmfi)
  {
        const Box& bx=Uoldmfi.growntilebox(1);
        AMREX_ASSERT(grids[Uoldmfi.index()].contains(Uoldmfi.tilebox())==true);

        ConvertUnew(Unew[Uoldmfi],Uold[Uoldmfi],alpha,bx);
  }
}